

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O0

string * __thiscall CodeGen::doGenerateType_abi_cxx11_(CodeGen *this,NodePtr *n)

{
  Type TVar1;
  type pNVar2;
  shared_ptr<avro::Node> *in_RDX;
  string *in_RDI;
  NodePtr *in_stack_000000b0;
  CodeGen *in_stack_000000b8;
  NodePtr *in_stack_000000f0;
  CodeGen *in_stack_000000f8;
  NodePtr *in_stack_00000270;
  CodeGen *in_stack_00000278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  allocator<char> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  string local_88 [8];
  NodePtr *in_stack_ffffffffffffff80;
  CodeGen *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38 [32];
  shared_ptr<avro::Node> *local_18;
  
  local_18 = in_RDX;
  pNVar2 = boost::shared_ptr<avro::Node>::operator->(in_RDX);
  TVar1 = avro::Node::type(pNVar2);
  switch(TVar1) {
  case AVRO_STRING:
  case AVRO_BYTES:
  case AVRO_INT:
  case AVRO_LONG:
  case AVRO_FLOAT:
  case AVRO_DOUBLE:
  case AVRO_BOOL:
  case AVRO_NULL:
  case AVRO_FIXED:
    cppTypeOf_abi_cxx11_(in_stack_000000b8,in_stack_000000b0);
    break;
  case AVRO_RECORD:
    generateRecordType_abi_cxx11_(in_stack_000000f8,in_stack_000000f0);
    break;
  case AVRO_ENUM:
    generateEnumType_abi_cxx11_(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    break;
  case AVRO_ARRAY:
    pNVar2 = boost::shared_ptr<avro::Node>::operator->(local_18);
    (*pNVar2->_vptr_Node[5])(pNVar2,0);
    pbVar3 = &local_58;
    generateType_abi_cxx11_(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::operator+((char *)pbVar3,in_stack_ffffffffffffff20);
    std::operator+(pbVar3,(char *)in_stack_ffffffffffffff20);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string((string *)&local_58);
    break;
  case AVRO_MAP:
    pNVar2 = boost::shared_ptr<avro::Node>::operator->(local_18);
    (*pNVar2->_vptr_Node[5])(pNVar2,1);
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff58;
    generateType_abi_cxx11_(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::operator+((char *)in_stack_ffffffffffffff28,pbVar3);
    std::operator+(in_stack_ffffffffffffff28,(char *)pbVar3);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
    break;
  case AVRO_UNION:
    generateUnionType_abi_cxx11_(in_stack_00000278,in_stack_00000270);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
  }
  return in_RDI;
}

Assistant:

string CodeGen::doGenerateType(const NodePtr& n)
{
    switch (n->type()) {
    case avro::AVRO_STRING:
    case avro::AVRO_BYTES:
    case avro::AVRO_INT:
    case avro::AVRO_LONG:
    case avro::AVRO_FLOAT:
    case avro::AVRO_DOUBLE:
    case avro::AVRO_BOOL:
    case avro::AVRO_NULL:
    case avro::AVRO_FIXED:
        return cppTypeOf(n);
    case avro::AVRO_ARRAY:
        return "std::vector<" + generateType(n->leafAt(0)) + " >";
    case avro::AVRO_MAP:
        return "std::map<std::string, " + generateType(n->leafAt(1)) + " >";
    case avro::AVRO_RECORD:
        return generateRecordType(n);
    case avro::AVRO_ENUM:
        return generateEnumType(n);
    case avro::AVRO_UNION:
        return generateUnionType(n);
    default:
        break;
    }
    return "$Undefuned$";
}